

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

BOOL SetCurrentDirectoryW(LPCWSTR lpPathName)

{
  int iVar1;
  BOOL BVar2;
  DWORD DVar3;
  size_t sVar4;
  char *lpMultiByteStr;
  DWORD dwErrCode;
  SIZE_T count;
  long in_FS_OFFSET;
  undefined1 local_70 [8];
  PathCharString dirPathString;
  
  dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  dirPathString._32_8_ = local_70;
  dirPathString.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0014bd39;
  if (lpPathName == (LPCWSTR)0x0) {
    dwErrCode = 0x7b;
LAB_0014bce4:
    BVar2 = 0;
    SetLastError(dwErrCode);
  }
  else {
    sVar4 = PAL_wcslen(lpPathName);
    count = sVar4 * 3 + 3;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_70,count);
    if (lpMultiByteStr == (char *)0x0) {
      dwErrCode = 8;
      goto LAB_0014bce4;
    }
    iVar1 = WideCharToMultiByte(0,0,lpPathName,-1,lpMultiByteStr,(int)count,(LPCSTR)0x0,(LPBOOL)0x0)
    ;
    if ((ulong)(long)iVar1 < dirPathString.m_size) {
      dirPathString.m_size = (long)iVar1;
    }
    *(undefined1 *)(dirPathString._32_8_ + dirPathString.m_size) = 0;
    if (iVar1 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) {
        dwErrCode = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014bd39;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","SetCurrentDirectoryW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
                ,0x1ed);
        dwErrCode = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
      }
      goto LAB_0014bce4;
    }
    BVar2 = SetCurrentDirectoryA(lpMultiByteStr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != dirPathString.m_count) {
      __stack_chk_fail();
    }
    return BVar2;
  }
LAB_0014bd39:
  abort();
}

Assistant:

BOOL
PALAPI
SetCurrentDirectoryW(
            IN LPCWSTR lpPathName)
{
    BOOL bRet;
    DWORD dwLastError = 0;
    PathCharString dirPathString;
    int  size;
    size_t length;
    char * dir;
    
    PERF_ENTRY(SetCurrentDirectoryW);
    ENTRY("SetCurrentDirectoryW(lpPathName=%p (%S))\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING);

   /*check if the given path is null. If so
     return FALSE*/
    if (lpPathName == NULL )
    {
        ERROR("Invalid path/directory name\n");
        dwLastError = ERROR_INVALID_NAME;
        bRet = FALSE;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * 3;
    dir = dirPathString.OpenStringBuffer(length);
    if (NULL == dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        bRet = FALSE;
        goto done;
    }
    
    size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, dir, length,
                                NULL, NULL );
    dirPathString.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        bRet = FALSE;
        goto done;
    }

    bRet = SetCurrentDirectoryA(dir);
done:
    if( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("SetCurrentDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(SetCurrentDirectoryW);
    return bRet;
}